

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall t_rs_generator::generate_typedef(t_rs_generator *this,t_typedef *ttypedef)

{
  t_type *ttype;
  ostream *poVar1;
  string *name;
  string local_68;
  undefined1 local_38 [8];
  string actual_type;
  t_typedef *ttypedef_local;
  t_rs_generator *this_local;
  
  actual_type.field_2._8_8_ = ttypedef;
  ttype = t_typedef::get_type(ttypedef);
  to_rust_type_abi_cxx11_((string *)local_38,this,ttype);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,"pub type ");
  name = t_typedef::get_symbolic_abi_cxx11_((t_typedef *)actual_type.field_2._8_8_);
  rust_safe_name(&local_68,this,name);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::operator<<(poVar1,(string *)local_38);
  poVar1 = std::operator<<(poVar1,";");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator<<((ostream *)&this->f_gen_,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_rs_generator::generate_typedef(t_typedef* ttypedef) {
  std::string actual_type = to_rust_type(ttypedef->get_type());
  f_gen_ << "pub type " << rust_safe_name(ttypedef->get_symbolic()) << " = " << actual_type << ";" << endl;
  f_gen_ << endl;
}